

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

wchar_t * create_expanded_text(wchar_t *original_text,TableRow *example_header,TableRow *body_row)

{
  item_delete_function p_Var1;
  wchar_t *__s2;
  _Bool _Var2;
  wchar_t wVar3;
  int iVar4;
  int iVar5;
  ItemQueue *item_queue;
  size_t sVar6;
  Item *item_00;
  ReplacementItem *item_01;
  ReplacementItem *item_2;
  wchar_t current_dest_pos;
  wchar_t current_src_pos;
  ReplacementItem *item_1;
  QueueItem *queue_item;
  wchar_t *pwStack_48;
  wchar_t new_text_length;
  wchar_t *text;
  ReplacementItem *item;
  wchar_t cell_text_length;
  wchar_t j;
  wchar_t i;
  wchar_t length;
  ItemQueue *replacement_list;
  TableRow *body_row_local;
  TableRow *example_header_local;
  wchar_t *original_text_local;
  
  item_queue = ItemQueue_new();
  sVar6 = wcslen(original_text);
  wVar3 = (wchar_t)sVar6;
  for (cell_text_length = L'\0'; cell_text_length < wVar3;
      cell_text_length = cell_text_length + L'\x01') {
    if (original_text[cell_text_length] == L'<') {
      for (item._4_4_ = L'\0'; item._4_4_ < example_header->table_cells->cell_count;
          item._4_4_ = item._4_4_ + L'\x01') {
        sVar6 = wcslen(example_header->table_cells->table_cells[item._4_4_].value);
        iVar5 = (int)sVar6;
        if ((iVar5 < (wVar3 - cell_text_length) + -1) &&
           (iVar4 = wcsncmp(original_text + (long)cell_text_length + 1,
                            example_header->table_cells->table_cells[item._4_4_].value,(long)iVar5),
           iVar4 == 0)) {
          item_00 = (Item *)malloc(0x18);
          item_00->item_delete = ReplacementItem_delete;
          *(wchar_t *)&item_00[1].item_delete = cell_text_length;
          *(int *)((long)&item_00[1].item_delete + 4) = iVar5 + 2;
          item_00[2].item_delete =
               (item_delete_function)body_row->table_cells->table_cells[item._4_4_].value;
          ItemQueue_add(item_queue,item_00);
        }
      }
    }
  }
  _Var2 = ItemQueue_is_empty(item_queue);
  if (_Var2) {
    pwStack_48 = (wchar_t *)malloc((long)(wVar3 + L'\x01') << 2);
    wmemcpy(pwStack_48,original_text,(long)wVar3);
    pwStack_48[wVar3] = L'\0';
  }
  else {
    queue_item._4_4_ = wVar3;
    for (item_1 = (ReplacementItem *)item_queue->first; item_1 != (ReplacementItem *)0x0;
        item_1 = *(ReplacementItem **)&item_1->start_position) {
      p_Var1 = item_1->item_delete;
      sVar6 = wcslen(*(wchar_t **)(p_Var1 + 0x10));
      queue_item._4_4_ = queue_item._4_4_ + ((int)sVar6 - *(int *)(p_Var1 + 0xc));
    }
    pwStack_48 = (wchar_t *)malloc((long)(queue_item._4_4_ + L'\x01') << 2);
    item_2._4_4_ = L'\0';
    item_2._0_4_ = 0;
    while (_Var2 = ItemQueue_is_empty(item_queue), ((_Var2 ^ 0xffU) & 1) != 0) {
      item_01 = (ReplacementItem *)ItemQueue_remove(item_queue);
      wmemcpy(pwStack_48 + (int)item_2,original_text + item_2._4_4_,
              (long)(item_01->start_position - item_2._4_4_));
      iVar5 = (item_01->start_position - item_2._4_4_) + (int)item_2;
      __s2 = item_01->new_text;
      sVar6 = wcslen(item_01->new_text);
      wmemcpy(pwStack_48 + iVar5,__s2,sVar6);
      sVar6 = wcslen(item_01->new_text);
      item_2._0_4_ = iVar5 + (int)sVar6;
      item_2._4_4_ = item_01->start_position + item_01->old_length;
      ReplacementItem_delete(item_01);
    }
    if (item_2._4_4_ < wVar3) {
      wmemcpy(pwStack_48 + (int)item_2,original_text + item_2._4_4_,(long)(wVar3 - item_2._4_4_));
    }
    pwStack_48[queue_item._4_4_] = L'\0';
  }
  ItemQueue_delete(item_queue);
  return pwStack_48;
}

Assistant:

static const wchar_t* create_expanded_text(const wchar_t* original_text, const TableRow* example_header, const TableRow* body_row) {
    ItemQueue* replacement_list = ItemQueue_new();
    int length = wcslen(original_text);
    int i;
    for (i = 0; i < length; ++i) {
        if (original_text[i] == L'<') {
            int j;
            for (j = 0; j < example_header->table_cells->cell_count; ++j) {
                int cell_text_length = wcslen(example_header->table_cells->table_cells[j].value);
                if (cell_text_length < length - i - 1 &&
                        wcsncmp(original_text + i + 1, example_header->table_cells->table_cells[j].value, cell_text_length) == 0) {
                    ReplacementItem* item = (ReplacementItem*)malloc(sizeof(ReplacementItem));
                    item->item_delete = (item_delete_function)ReplacementItem_delete;
                    item->start_position = i;
                    item->old_length = cell_text_length + 2;
                    item->new_text = body_row->table_cells->table_cells[j].value;
                    ItemQueue_add(replacement_list, (Item*)item);
                }
            }
        }
    }
    wchar_t* text;
    if (ItemQueue_is_empty(replacement_list)) {
        text = (wchar_t*)malloc((length + 1) * sizeof(wchar_t));
        wmemcpy(text, original_text, length);
        text[length] = L'\0';
    }
    else {
        int new_text_length = length;
        QueueItem* queue_item = replacement_list->first;
        while (queue_item) {
            ReplacementItem* item = (ReplacementItem*)queue_item->item;
            new_text_length += wcslen(item->new_text) - item->old_length;
            queue_item = queue_item->next;
        }
        text = (wchar_t*)malloc((new_text_length + 1) * sizeof(wchar_t));
        int current_src_pos = 0;
        int current_dest_pos = 0;
        while (!ItemQueue_is_empty(replacement_list)) {
            ReplacementItem* item = (ReplacementItem*)ItemQueue_remove(replacement_list);
            wmemcpy(text + current_dest_pos, original_text + current_src_pos, item->start_position - current_src_pos);
            current_dest_pos += item->start_position - current_src_pos;
            wmemcpy(text + current_dest_pos, item->new_text, wcslen(item->new_text));
            current_dest_pos += wcslen(item->new_text);
            current_src_pos += item->start_position - current_src_pos + item->old_length;
            ReplacementItem_delete(item);
        }
        if (current_src_pos < length) {
            wmemcpy(text + current_dest_pos, original_text + current_src_pos, length - current_src_pos);
        }
        text[new_text_length] = L'\0';
    }
    ItemQueue_delete(replacement_list);
    return text;
}